

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_20::CompareSortKeys<google::protobuf::Descriptor>
               (Descriptor *a,Descriptor *b)

{
  bool bVar1;
  string local_58;
  string local_38;
  Descriptor *local_18;
  Descriptor *b_local;
  Descriptor *a_local;
  
  local_18 = b;
  b_local = a;
  GetSortKey<google::protobuf::Descriptor>(&local_38,a);
  GetSortKey<google::protobuf::Descriptor>(&local_58,local_18);
  bVar1 = std::operator<(&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool CompareSortKeys(const T* a, const T* b) {
  return GetSortKey(*a) < GetSortKey(*b);
}